

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  ImWchar c;
  ImWchar c_00;
  
  while( true ) {
    c_00 = *ranges;
    if (c_00 == 0) break;
    for (; c_00 <= ranges[1]; c_00 = c_00 + 1) {
      AddChar(this,c_00);
    }
    ranges = ranges + 2;
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}